

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall
cmGeneratorTarget::GetImplibGNUtoMS
          (cmGeneratorTarget *this,string *config,string *gnuName,string *out,char *newExt)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  char *__s;
  bool bVar4;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_98;
  long *local_78 [2];
  long local_68 [2];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_58;
  size_t local_40;
  char *local_38;
  undefined8 local_30;
  
  bVar2 = HasImplibGNUtoMS(this,config);
  if ((bVar2) && (6 < gnuName->_M_string_length)) {
    std::__cxx11::string::substr((ulong)local_78,(ulong)gnuName);
    iVar3 = std::__cxx11::string::compare((char *)local_78);
    bVar4 = iVar3 == 0;
    bVar2 = true;
  }
  else {
    bVar2 = false;
    bVar4 = false;
  }
  if ((bVar2) && (local_78[0] != local_68)) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (bVar4 != false) {
    local_58.first._M_str = (gnuName->_M_dataplus)._M_p;
    uVar1 = gnuName->_M_string_length;
    local_58.first._M_len = uVar1 - 6;
    if (uVar1 < uVar1 - 6) {
      local_58.first._M_len = uVar1;
    }
    __s = ".lib";
    if (newExt != (char *)0x0) {
      __s = newExt;
    }
    local_58.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_40 = strlen(__s);
    local_30 = 0;
    views._M_len = 2;
    views._M_array = &local_58;
    local_38 = __s;
    cmCatViews(&local_98,views);
    std::__cxx11::string::operator=((string *)out,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar4;
}

Assistant:

bool cmGeneratorTarget::GetImplibGNUtoMS(std::string const& config,
                                         std::string const& gnuName,
                                         std::string& out,
                                         const char* newExt) const
{
  if (this->HasImplibGNUtoMS(config) && gnuName.size() > 6 &&
      gnuName.substr(gnuName.size() - 6) == ".dll.a") {
    out = cmStrCat(cm::string_view(gnuName).substr(0, gnuName.size() - 6),
                   newExt ? newExt : ".lib");
    return true;
  }
  return false;
}